

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

bool __thiscall Potassco::AspifTextInput::matchDirective(AspifTextInput *this)

{
  AbstractProgram *pAVar1;
  Data *this_00;
  bool bVar2;
  int bound;
  Atom_t AVar3;
  uint uVar4;
  BufferedStream *this_01;
  undefined8 uVar5;
  uint uVar6;
  char *term;
  uint x;
  uint uVar7;
  undefined **ppuVar8;
  AtomSpan local_50;
  LitSpan local_40;
  
  bound = 0;
  bVar2 = match(this,"#minimize",false);
  if (bVar2) {
    RuleBuilder::startMinimize(&this->data_->rule,0);
    matchAgg(this);
    bVar2 = match(this,"@",false);
    if (bVar2) {
      bound = matchInt(this);
    }
    match(this,".",true);
    RuleBuilder::setBound(&this->data_->rule,bound);
    RuleBuilder::end(&this->data_->rule,this->out_);
  }
  else {
    bVar2 = match(this,"#project",false);
    if (bVar2) {
      RuleBuilder::start(&this->data_->rule,(Head_t)0x0);
      bVar2 = match(this,"{",false);
      if (bVar2) {
        matchAtoms(this,",");
        match(this,"}",true);
      }
      match(this,".",true);
      pAVar1 = this->out_;
      local_50 = RuleBuilder::head(&this->data_->rule);
      (*pAVar1->_vptr_AbstractProgram[7])(pAVar1);
    }
    else {
      bVar2 = match(this,"#output",false);
      if (bVar2) {
        matchTerm(this);
        matchCondition(this);
        match(this,".",true);
        pAVar1 = this->out_;
        this_00 = this->data_;
        local_50.size = (this_00->symbol)._M_string_length;
        local_50.first = (uint *)local_50.size;
        if ((uint *)local_50.size != (uint *)0x0) {
          local_50.first = (uint *)(this_00->symbol)._M_dataplus._M_p;
        }
        local_40 = RuleBuilder::body(&this_00->rule);
        (*pAVar1->_vptr_AbstractProgram[8])(pAVar1,&local_50,&local_40);
      }
      else {
        bVar2 = match(this,"#external",false);
        if (bVar2) {
          AVar3 = matchId(this);
          match(this,".",true);
          bVar2 = match(this,"[",false);
          uVar5 = 2;
          if (bVar2) {
            bVar2 = match(this,"true",false);
            uVar5 = 1;
            if (!bVar2) {
              bVar2 = match(this,"free",false);
              uVar5 = 0;
              if (!bVar2) {
                bVar2 = match(this,"release",false);
                uVar5 = 3;
                if (!bVar2) {
                  match(this,"false",true);
                  uVar5 = 2;
                }
              }
            }
            match(this,"]",true);
          }
          (*this->out_->_vptr_AbstractProgram[9])(this->out_,(ulong)AVar3,uVar5);
        }
        else {
          bVar2 = match(this,"#assume",false);
          if (bVar2) {
            RuleBuilder::startBody(&this->data_->rule);
            bVar2 = match(this,"{",false);
            if (bVar2) {
              matchLits(this);
              match(this,"}",true);
            }
            match(this,".",true);
            pAVar1 = this->out_;
            local_50 = (AtomSpan)RuleBuilder::body(&this->data_->rule);
            (*pAVar1->_vptr_AbstractProgram[10])(pAVar1);
          }
          else {
            uVar6 = 0;
            bVar2 = match(this,"#heuristic",false);
            if (bVar2) {
              AVar3 = matchId(this);
              matchCondition(this);
              match(this,".",true);
              match(this,"[",true);
              uVar4 = matchInt(this);
              bVar2 = match(this,"@",false);
              if (bVar2) {
                uVar6 = matchInt(this);
                ProgramReader::require
                          (&this->super_ProgramReader,(bool)((byte)~(byte)(uVar6 >> 0x18) >> 7),
                           "positive priority expected");
              }
              match(this,",",true);
              uVar7 = 0;
              ppuVar8 = &PTR_anon_var_dwarf_19789_0012c450;
              do {
                term = "";
                if (uVar7 < 6) {
                  term = *ppuVar8;
                }
                bVar2 = match(this,term,false);
                if (bVar2) goto LAB_0010a47b;
                uVar7 = uVar7 + 1;
                ppuVar8 = ppuVar8 + 1;
              } while (uVar7 != 6);
              uVar7 = 0xffffffff;
LAB_0010a47b:
              ProgramReader::require
                        (&this->super_ProgramReader,(bool)((byte)~(byte)(uVar7 >> 0x18) >> 7),
                         "unrecognized heuristic modification");
              this_01 = ProgramReader::stream(&this->super_ProgramReader);
              BufferedStream::skipWs(this_01);
              match(this,"]",true);
              pAVar1 = this->out_;
              local_50 = (AtomSpan)RuleBuilder::body(&this->data_->rule);
              (*pAVar1->_vptr_AbstractProgram[0xb])
                        (pAVar1,(ulong)AVar3,(ulong)uVar7,(ulong)uVar4,(ulong)uVar6);
            }
            else {
              bVar2 = match(this,"#edge",false);
              if (bVar2) {
                match(this,"(",true);
                uVar6 = matchInt(this);
                match(this,",",true);
                uVar4 = matchInt(this);
                match(this,")",true);
                matchCondition(this);
                match(this,".",true);
                pAVar1 = this->out_;
                local_50 = (AtomSpan)RuleBuilder::body(&this->data_->rule);
                (*pAVar1->_vptr_AbstractProgram[0xc])(pAVar1,(ulong)uVar6,(ulong)uVar4);
              }
              else {
                bVar2 = match(this,"#step",false);
                if (bVar2) {
                  bVar2 = ProgramReader::incremental(&this->super_ProgramReader);
                  ProgramReader::require
                            (&this->super_ProgramReader,bVar2,"#step requires incremental program");
                  match(this,".",true);
                  return false;
                }
                bVar2 = match(this,"#incremental",false);
                if (bVar2) {
                  match(this,".",true);
                }
                else {
                  ProgramReader::require(&this->super_ProgramReader,false,"unrecognized directive");
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool AspifTextInput::matchDirective() {
	if (match("#minimize", false)) {
		data_->rule.startMinimize(0);
		matchAgg();
		Weight_t prio = match("@", false) ? matchInt() : 0;
		match(".");
		data_->rule.setBound(prio);
		data_->rule.end(out_);
	}
	else if (match("#project", false)) {
		data_->rule.start();
		if (match("{", false)) {
			matchAtoms(",");
			match("}");
		}
		match(".");
		out_->project(data_->atoms());
	}
	else if (match("#output", false)) {
		matchTerm();
		matchCondition();
		match(".");
		out_->output(toSpan(data_->symbol), data_->lits());
	}
	else if (match("#external", false)) {
		Atom_t  a = matchId();
		Value_t v = Value_t::False;
		match(".");
		if (match("[", false)) {
			if      (match("true", false))    { v = Value_t::True; }
			else if (match("free", false))    { v = Value_t::Free; }
			else if (match("release", false)) { v = Value_t::Release; }
			else                              { match("false"); }
			match("]");
		}
		out_->external(a, v);
	}
	else if (match("#assume", false)) {
		data_->rule.startBody();
		if (match("{", false)) {
			matchLits();
			match("}");
		}
		match(".");
		out_->assume(data_->lits());
	}
	else if (match("#heuristic", false)) {
		Atom_t a = matchId();
		matchCondition();
		match(".");
		match("[");
		int v = matchInt();
		int p = 0;
		if (match("@", false)) { p = matchInt(); require(p >= 0, "positive priority expected"); }
		match(",");
		int h = -1;
		for (unsigned x = 0; x <= static_cast<unsigned>(Heuristic_t::eMax); ++x) {
			if (match(toString(static_cast<Heuristic_t>(x)), false)) {
				h = static_cast<int>(x);
				break;
			}
		}
		require(h >= 0, "unrecognized heuristic modification");
		skipws();
		match("]");
		out_->heuristic(a, static_cast<Heuristic_t>(h), v, static_cast<unsigned>(p), data_->lits());
	}
	else if (match("#edge", false)) {
		int s, t;
		match("("), s = matchInt(), match(","), t = matchInt(), match(")");
		matchCondition();
		match(".");
		out_->acycEdge(s, t, data_->lits());
	}
	else if (match("#step", false)) {
		require(incremental(), "#step requires incremental program");
		match(".");
		return false;
	}
	else if (match("#incremental", false)) {
		match(".");
	}
	else {
		require(false, "unrecognized directive");
	}
	return true;
}